

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(short lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  undefined8 in_RAX;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  short ret;
  undefined8 local_18;
  
  local_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_18 = (ulong)CONCAT42(local_18._4_4_,lhs) << 0x10;
  bVar1 = DivisionCornerCaseHelper2<short,_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase2
                    (lhs,rhs,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                             )&local_18);
  if (bVar1) {
  }
  else {
    local_18 = (ulong)CONCAT24(rhs.m_int,(int)local_18);
    DivisionHelper<short,_short,_5>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((short *)((long)&local_18 + 2),(short *)((long)&local_18 + 4),
               (short *)((long)&local_18 + 6));
    local_18._0_2_ = local_18._6_2_;
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_18._0_2_;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}